

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O2

void Abc_ObjPatchFanin(Abc_Obj_t *pObj,Abc_Obj_t *pFaninOld,Abc_Obj_t *pFaninNew)

{
  uint i;
  int iVar1;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanio.c"
                  ,0xb0,"void Abc_ObjPatchFanin(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)");
  }
  if (((ulong)pFaninOld & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pFaninOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanio.c"
                  ,0xb1,"void Abc_ObjPatchFanin(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)");
  }
  pAVar3 = (Abc_Obj_t *)((ulong)pFaninNew & 0xfffffffffffffffe);
  if (pAVar3 == pFaninOld) {
    __assert_fail("pFaninOld != pFaninNewR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanio.c"
                  ,0xb2,"void Abc_ObjPatchFanin(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)");
  }
  if (pObj->pNtk == pFaninOld->pNtk) {
    if (pObj->pNtk != pAVar3->pNtk) {
      __assert_fail("pObj->pNtk == pFaninNewR->pNtk",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanio.c"
                    ,0xb6,"void Abc_ObjPatchFanin(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)");
    }
    i = Vec_IntFind(&pObj->vFanins,pFaninOld->Id);
    if (i != 0xffffffff) {
      Vec_IntWriteEntry(&pObj->vFanins,i,pAVar3->Id);
      if (((ulong)pFaninNew & 1) != 0) {
        if (1 < i) {
          __assert_fail("i >=0 && i < 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                        ,0x17f,"void Abc_ObjXorFaninC(Abc_Obj_t *, int)");
        }
        *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 ^ (uint)(i != 0) * 0x400 + 0x400;
      }
      iVar1 = Vec_IntRemove(&pFaninOld->vFanouts,pObj->Id);
      if (iVar1 == 0) {
        pcVar2 = Abc_ObjName(pObj);
        printf("Node %s is not among",pcVar2);
        pcVar2 = Abc_ObjName(pFaninOld);
        printf(" the fanouts of its old fanin %s...\n",pcVar2);
      }
      Vec_IntPushMem(pObj->pNtk->pMmStep,&pAVar3->vFanouts,pObj->Id);
      return;
    }
    pcVar2 = Abc_ObjName(pFaninOld);
    printf("Node %s is not among",pcVar2);
    pcVar2 = Abc_ObjName(pObj);
    printf(" the fanins of node %s...\n",pcVar2);
    return;
  }
  __assert_fail("pObj->pNtk == pFaninOld->pNtk",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanio.c"
                ,0xb5,"void Abc_ObjPatchFanin(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)");
}

Assistant:

void Abc_ObjPatchFanin( Abc_Obj_t * pObj, Abc_Obj_t * pFaninOld, Abc_Obj_t * pFaninNew )
{
    Abc_Obj_t * pFaninNewR = Abc_ObjRegular(pFaninNew);
    int iFanin;//, nLats;//, fCompl;
    assert( !Abc_ObjIsComplement(pObj) );
    assert( !Abc_ObjIsComplement(pFaninOld) );
    assert( pFaninOld != pFaninNewR );
//    assert( pObj != pFaninOld );
//    assert( pObj != pFaninNewR );
    assert( pObj->pNtk == pFaninOld->pNtk );
    assert( pObj->pNtk == pFaninNewR->pNtk );
    if ( (iFanin = Vec_IntFind( &pObj->vFanins, pFaninOld->Id )) == -1 )
    {
        printf( "Node %s is not among", Abc_ObjName(pFaninOld) );
        printf( " the fanins of node %s...\n", Abc_ObjName(pObj) );
        return;
    }

    // remember the attributes of the old fanin
//    fCompl = Abc_ObjFaninC(pObj, iFanin);
    // replace the old fanin entry by the new fanin entry (removes attributes)
    Vec_IntWriteEntry( &pObj->vFanins, iFanin, pFaninNewR->Id );
    // set the attributes of the new fanin
//    if ( fCompl ^ Abc_ObjIsComplement(pFaninNew) )
//        Abc_ObjSetFaninC( pObj, iFanin );
    if ( Abc_ObjIsComplement(pFaninNew) )
        Abc_ObjXorFaninC( pObj, iFanin );

//    if ( Abc_NtkIsSeq(pObj->pNtk) && (nLats = Seq_ObjFaninL(pObj, iFanin)) )
//        Seq_ObjSetFaninL( pObj, iFanin, nLats );
    // update the fanout of the fanin
    if ( !Vec_IntRemove( &pFaninOld->vFanouts, pObj->Id ) )
    {
        printf( "Node %s is not among", Abc_ObjName(pObj) );
        printf( " the fanouts of its old fanin %s...\n", Abc_ObjName(pFaninOld) );
//        return;
    }
    Vec_IntPushMem( pObj->pNtk->pMmStep, &pFaninNewR->vFanouts, pObj->Id );
}